

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O2

Optional<llvm::object::SectionedAddress> * __thiscall
llvm::function_ref<llvm::Optional<llvm::object::SectionedAddress>(unsigned_int)>::
callback_fn<llvm::DWARFContext::dump(llvm::raw_ostream&,llvm::DIDumpOptions,std::array<llvm::Optional<unsigned_long>,28ul>)::__4>
          (Optional<llvm::object::SectionedAddress> *__return_storage_ptr__,
          function_ref<llvm::Optional<llvm::object::SectionedAddress>(unsigned_int)> *this,
          intptr_t callable,uint params)

{
  unit_iterator_range uVar1;
  
  uVar1 = DWARFContext::info_section_units(*(DWARFContext **)this);
  if (uVar1.begin_iterator == uVar1.end_iterator) {
    (__return_storage_ptr__->Storage).field_0.empty = '\0';
    (__return_storage_ptr__->Storage).hasVal = false;
  }
  else {
    DWARFUnit::getAddrOffsetSectionItem
              (__return_storage_ptr__,
               ((uVar1.begin_iterator)->_M_t).
               super___uniq_ptr_impl<llvm::DWARFUnit,_std::default_delete<llvm::DWARFUnit>_>._M_t.
               super__Tuple_impl<0UL,_llvm::DWARFUnit_*,_std::default_delete<llvm::DWARFUnit>_>.
               super__Head_base<0UL,_llvm::DWARFUnit_*,_false>._M_head_impl,(uint32_t)callable);
  }
  return __return_storage_ptr__;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params ...params) {
    return (*reinterpret_cast<Callable*>(callable))(
        std::forward<Params>(params)...);
  }